

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_indexed_child_t art_node_prev_child(art_node_t *node,int index)

{
  long lVar1;
  art_node_t *paVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  art_indexed_child_t aVar6;
  
  uVar3 = 0;
  paVar2 = (art_node_t *)0x0;
  uVar5 = 0;
  if (((ulong)node & 1) != 0) goto LAB_00111ca1;
  switch(*node) {
  case (art_node_t)0x0:
    if ((int)(uint)(byte)node[7] < index) {
      index = (uint)(byte)node[7];
    }
    if (0 < index) {
      uVar3 = (ulong)(index - 1);
      paVar2 = *(art_node_t **)(node + uVar3 * 8 + 0x10);
LAB_00111c78:
      uVar3 = (ulong)(byte)node[uVar3 + 8] * 0x100 + uVar3;
      uVar5 = (uint)uVar3;
      goto LAB_00111ca1;
    }
    break;
  case (art_node_t)0x1:
    if ((int)(uint)(byte)node[7] < index) {
      index = (uint)(byte)node[7];
    }
    if (0 < index) {
      uVar3 = (ulong)(index - 1);
      paVar2 = *(art_node_t **)(node + uVar3 * 8 + 0x18);
      goto LAB_00111c78;
    }
    break;
  case (art_node_t)0x2:
    uVar3 = (ulong)(uint)index;
    paVar2 = (art_node_t *)0x0;
    do {
      if ((int)uVar3 < 1) {
        uVar3 = 0;
        goto LAB_00111c97;
      }
      lVar1 = uVar3 + 0xf;
      uVar3 = uVar3 - 1;
    } while ((ulong)(byte)node[lVar1] == 0x30);
    paVar2 = *(art_node_t **)(node + (ulong)(byte)node[lVar1] * 8 + 0x110);
    uVar3 = uVar3 & 0xff;
    goto LAB_00111c97;
  case (art_node_t)0x3:
    uVar4 = (ulong)(uint)index;
    uVar3 = 0;
    do {
      if ((int)uVar4 < 1) {
        paVar2 = (art_node_t *)0x0;
        goto LAB_00111c97;
      }
      paVar2 = *(art_node_t **)(node + uVar4 * 8 + 8);
      uVar4 = uVar4 - 1;
    } while (paVar2 == (art_node_t *)0x0);
    uVar3 = uVar4 & 0xff;
LAB_00111c97:
    uVar5 = (int)uVar3 << 8;
    goto LAB_00111ca1;
  }
  uVar3 = 0;
  paVar2 = (art_node_t *)0x0;
  uVar5 = 0;
LAB_00111ca1:
  aVar6._8_8_ = uVar3 & 0xff | (ulong)(uVar5 & 0xff00);
  aVar6.child = paVar2;
  return aVar6;
}

Assistant:

static art_indexed_child_t art_node_prev_child(const art_node_t *node,
                                               int index) {
    if (art_is_leaf(node)) {
        art_indexed_child_t indexed_child;
        indexed_child.child = NULL;
        return indexed_child;
    }
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE:
            return art_node4_prev_child((art_node4_t *)node, index);
        case ART_NODE16_TYPE:
            return art_node16_prev_child((art_node16_t *)node, index);
        case ART_NODE48_TYPE:
            return art_node48_prev_child((art_node48_t *)node, index);
        case ART_NODE256_TYPE:
            return art_node256_prev_child((art_node256_t *)node, index);
        default:
            assert(false);
            return (art_indexed_child_t){0};
    }
}